

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

int sha256(uint8_t *src,uint32_t len,uint32_t *hash)

{
  uint32_t local_d8;
  undefined4 uStack_d4;
  uint32_t h [8];
  uint32_t m;
  uint32_t n;
  uint32_t i;
  uint32_t cover_size;
  uint8_t cover_data [128];
  uint8_t *tmp;
  uint32_t *hash_local;
  uint32_t len_local;
  uint8_t *src_local;
  
  h[7] = 0;
  h[6] = 0;
  local_d8 = 0x6a09e667;
  uStack_d4 = 0xbb67ae85;
  h[0] = 0x3c6ef372;
  h[1] = 0xa54ff53a;
  h[2] = 0x510e527f;
  h[3] = 0x9b05688c;
  h[4] = 0x1f83d9ab;
  h[5] = 0x5be0cd19;
  cover_data._120_8_ = src;
  memset(&i,0,0x80);
  h[7] = len >> 6;
  h[6] = len & 0x3f;
  if (h[6] < 0x38) {
    n = 0x40;
  }
  else {
    n = 0x80;
  }
  if (h[6] != 0) {
    memcpy(&i,(void *)(cover_data._120_8_ + (ulong)(h[7] << 6)),(ulong)h[6]);
  }
  *(undefined1 *)((long)&i + (ulong)h[6]) = 0x80;
  *(char *)((long)&i + (ulong)(n - 4)) = (char)(((len & 0x1fe00000) << 3) >> 0x18);
  *(char *)((long)&i + (ulong)(n - 3)) = (char)(((len & 0x1fe000) << 3) >> 0x10);
  *(char *)((long)&i + (ulong)(n - 2)) = (char)(((len & 0x1fe0) << 3) >> 8);
  *(char *)((long)&i + (ulong)(n - 1)) = (char)(len << 3);
  for (m = 0; m < h[7]; m = m + 1) {
    ztransform((uint8_t *)cover_data._120_8_,&local_d8);
    cover_data._120_8_ = cover_data._120_8_ + 0x40;
  }
  cover_data._120_8_ = &i;
  h[7] = n >> 6;
  for (m = 0; m < h[7]; m = m + 1) {
    ztransform((uint8_t *)cover_data._120_8_,&local_d8);
    cover_data._120_8_ = cover_data._120_8_ + 0x40;
  }
  if (hash != (uint32_t *)0x0) {
    *(ulong *)hash = CONCAT44(uStack_d4,local_d8);
    *(ulong *)(hash + 2) = CONCAT44(h[1],h[0]);
    *(ulong *)(hash + 4) = CONCAT44(h[3],h[2]);
    *(ulong *)(hash + 6) = CONCAT44(h[5],h[4]);
  }
  return 0;
}

Assistant:

int sha256(const uint8_t *src, uint32_t len, uint32_t *hash)
{
    uint8_t *tmp = (uint8_t*)src;
    uint8_t  cover_data[SHA256_COVER_SIZE];
    uint32_t cover_size = 0;

    uint32_t i = 0;
    uint32_t n = 0;
    uint32_t m = 0;
    uint32_t h[8];

    h[0] = 0x6a09e667;
    h[1] = 0xbb67ae85;
    h[2] = 0x3c6ef372;
    h[3] = 0xa54ff53a;
    h[4] = 0x510e527f;
    h[5] = 0x9b05688c;
    h[6] = 0x1f83d9ab;
    h[7] = 0x5be0cd19;

    memset(cover_data, 0x00, sizeof(uint8_t)*SHA256_COVER_SIZE);

    n = len / SHA256_BLOCK_SIZE;
    m = len % SHA256_BLOCK_SIZE;

    if (m < 56 ) {
        cover_size = SHA256_BLOCK_SIZE;
    }else {
        cover_size = SHA256_BLOCK_SIZE*2;
    }

    if (m != 0) {
        memcpy(cover_data, tmp + (n * SHA256_BLOCK_SIZE), m);
    }
    cover_data[m] = 0x80;
    cover_data[cover_size-4]  = ((len*8)&0xff000000) >> 24;
    cover_data[cover_size-3]  = ((len*8)&0x00ff0000) >> 16;
    cover_data[cover_size-2]  = ((len*8)&0x0000ff00) >> 8;
    cover_data[cover_size-1]  = ((len*8)&0x000000ff);

    zdump_hex(tmp, len-m);
    zdump_hex(cover_data, cover_size);

    for (i=0; i<n; i++) {
        ztransform(tmp, h);
        tmp += SHA256_BLOCK_SIZE;
    }

    tmp = cover_data;
    n = cover_size / SHA256_BLOCK_SIZE;
    for (i=0; i<n; i++) {
        ztransform(tmp, h);
        tmp += SHA256_BLOCK_SIZE;
    }

    if (NULL != hash) {
        memcpy(hash, h, sizeof(uint32_t)*8);
    }
    return 0;
}